

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_call.cpp
# Opt level: O1

void libtorrent::aux::blocking_call(void)

{
  return;
}

Assistant:

void blocking_call()
{
#ifdef TORRENT_PROFILE_CALLS
	char stack[2048];
	print_backtrace(stack, sizeof(stack), 20);
	std::unique_lock<std::mutex> l(g_calls_mutex);
	g_blocking_calls[stack] += 1;
#endif
}